

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::Private::interrupt(Private *this)

{
  bool bVar1;
  Guard local_18;
  Guard guard;
  Private *this_local;
  
  guard._mutex = (Mutex *)this;
  Mutex::Guard::Guard(&local_18,&this->_interruptMutex);
  bVar1 = (this->_interrupted & 1U) == 0;
  if (bVar1) {
    this->_interrupted = true;
  }
  Mutex::Guard::~Guard(&local_18);
  if (bVar1) {
    Socket::Poll::interrupt(&this->_sockets);
  }
  return;
}

Assistant:

void Server::Private::interrupt()
{
  {
    Mutex::Guard guard(_interruptMutex);
    if (_interrupted)
      return;
    _interrupted = true;
  }
  _sockets.interrupt();
}